

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChFunction_Sequence.cpp
# Opt level: O1

double __thiscall chrono::ChFunction_Sequence::Get_y(ChFunction_Sequence *this,double x)

{
  undefined1 auVar1 [16];
  _List_node_base *p_Var2;
  double dVar3;
  double dVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [64];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  
  p_Var2 = (this->functions).
           super__List_base<chrono::ChFseqNode,_std::allocator<chrono::ChFseqNode>_>._M_impl._M_node
           .super__List_node_base._M_next;
  if (p_Var2 == (_List_node_base *)&this->functions) {
    dVar4 = 0.0;
  }
  else {
    auVar6 = ZEXT864(0);
    do {
      if (((double)p_Var2[3]._M_next <= x) && (x < (double)p_Var2[3]._M_prev)) {
        dVar4 = x - (double)p_Var2[3]._M_next;
        dVar3 = (double)(**(code **)((long)(p_Var2[1]._M_next)->_M_next + 0x20))();
        auVar8._8_8_ = 0;
        auVar8._0_8_ = dVar4;
        auVar1._8_8_ = 0;
        auVar1._0_8_ = p_Var2[4]._M_prev;
        auVar7._8_8_ = 0;
        auVar7._0_8_ = dVar3 + (double)p_Var2[4]._M_next;
        auVar1 = vfmadd231sd_fma(auVar7,auVar8,auVar1);
        auVar5._8_8_ = 0;
        auVar5._0_8_ = dVar4 * (double)p_Var2[5]._M_next;
        auVar1 = vfmadd213sd_fma(auVar5,auVar8,auVar1);
        auVar6 = ZEXT1664(auVar1);
      }
      dVar4 = auVar6._0_8_;
      p_Var2 = p_Var2->_M_next;
    } while (p_Var2 != (_List_node_base *)&this->functions);
  }
  return dVar4;
}

Assistant:

double ChFunction_Sequence::Get_y(double x) const {
    double res = 0;
    double localtime;
    for (auto iter = functions.begin(); iter != functions.end(); ++iter) {
        if ((x >= iter->t_start) && (x < iter->t_end)) {
            localtime = x - iter->t_start;
            res = iter->fx->Get_y(localtime) + iter->Iy + iter->Iydt * localtime + iter->Iydtdt * localtime * localtime;
        }
    }
    return res;
}